

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O3

void __thiscall
Rml::PropertySpecification::ParsePropertyValues
          (PropertySpecification *this,StringList *values_list,String *values,
          SplitOption split_option)

{
  byte bVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  byte bVar5;
  String value;
  int local_84;
  String local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  String local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_58 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)values_list;
  if (values->_M_string_length != 0) {
    bVar5 = 0;
    uVar4 = 0;
    local_84 = 0;
    do {
      if (bVar5 < 4) {
        bVar1 = (values->_M_dataplus)._M_p[uVar4];
        uVar2 = (ulong)bVar1;
        cVar3 = (char)&local_50;
        switch(bVar5) {
        case 0:
          if (bVar1 == 0x3b) {
            StringUtilities::StripWhitespace(&local_78,&local_50);
LAB_0025b6a5:
            ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (local_50._M_string_length != 0) {
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_58,&local_50);
LAB_0025b6df:
              bVar5 = 0;
LAB_0025b6e1:
              local_50._M_string_length = 0;
              *local_50._M_dataplus._M_p = '\0';
              break;
            }
          }
          else {
            if (split_option == Comma) {
              if (bVar1 == 0x22) goto LAB_0025b5eb;
              if (bVar1 == 0x28) {
LAB_0025b763:
                local_84 = 1;
                ::std::__cxx11::string::push_back(cVar3);
                bVar5 = 1;
                break;
              }
              if (bVar1 == 0x2c) goto LAB_0025b690;
            }
            else if (bVar1 < 0x29) {
              if ((0x100002600U >> (uVar2 & 0x3f) & 1) == 0) {
                if (uVar2 == 0x22) {
                  if (split_option != Whitespace) goto LAB_0025b5eb;
                  StringUtilities::StripWhitespace(&local_78,&local_50);
                  ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                  }
                  if (local_50._M_string_length == 0) {
                    bVar5 = 2;
                    break;
                  }
                  bVar5 = 2;
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_58,&local_50);
                  goto LAB_0025b6e1;
                }
                if (uVar2 == 0x28) goto LAB_0025b763;
              }
              else if (split_option != None) {
LAB_0025b690:
                StringUtilities::StripWhitespace(&local_78,&local_50);
                goto LAB_0025b6a5;
              }
            }
            ::std::__cxx11::string::push_back(cVar3);
          }
LAB_0025b7a1:
          bVar5 = 0;
          break;
        case 1:
          if (bVar1 == 0x22) {
            bVar5 = 2;
          }
          else if (bVar1 == 0x29) {
            local_84 = local_84 + -1;
            bVar5 = local_84 != 0;
          }
          else {
            bVar5 = 1;
            if (bVar1 == 0x28) {
              local_84 = local_84 + 1;
            }
          }
          ::std::__cxx11::string::push_back(cVar3);
          break;
        case 2:
          if (bVar1 == 0x5c) {
            bVar5 = 3;
          }
          else {
            if (bVar1 != 0x22) goto LAB_0025b5eb;
            if (local_84 == 0) {
              if (split_option == Whitespace) {
                StringUtilities::StripWhitespace(&local_78,&local_50);
                ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                if (local_50._M_string_length != 0) {
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_58,&local_50);
                  local_84 = 0;
                  goto LAB_0025b6df;
                }
              }
              else {
                ::std::__cxx11::string::push_back(cVar3);
              }
              local_84 = 0;
              goto LAB_0025b7a1;
            }
            bVar5 = 1;
            ::std::__cxx11::string::push_back(cVar3);
          }
          break;
        case 3:
          if ((bVar1 != 0x22) && (bVar1 != 0x5c)) {
            ::std::__cxx11::string::push_back(cVar3);
          }
LAB_0025b5eb:
          bVar5 = 2;
          ::std::__cxx11::string::push_back(cVar3);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < values->_M_string_length);
    if (bVar5 != 0) goto LAB_0025b888;
  }
  StringUtilities::StripWhitespace(&local_78,&local_50);
  ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_50._M_string_length != 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_58,&local_50);
    local_50._M_string_length = 0;
    *local_50._M_dataplus._M_p = '\0';
  }
LAB_0025b888:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void PropertySpecification::ParsePropertyValues(StringList& values_list, const String& values, const SplitOption split_option) const
{
	const bool split_values = (split_option != SplitOption::None);
	const bool split_by_comma = (split_option == SplitOption::Comma);
	const bool split_by_whitespace = (split_option == SplitOption::Whitespace);

	String value;

	auto SubmitValue = [&]() {
		value = StringUtilities::StripWhitespace(value);
		if (value.size() > 0)
		{
			values_list.push_back(value);
			value.clear();
		}
	};

	enum ParseState { VALUE, VALUE_PARENTHESIS, VALUE_QUOTE, VALUE_QUOTE_ESCAPE_NEXT };
	ParseState state = VALUE;
	int open_parentheses = 0;
	size_t character_index = 0;

	while (character_index < values.size())
	{
		const char character = values[character_index];
		character_index++;

		switch (state)
		{
		case VALUE:
		{
			if (character == ';')
			{
				value = StringUtilities::StripWhitespace(value);
				if (value.size() > 0)
				{
					values_list.push_back(value);
					value.clear();
				}
			}
			else if (split_by_comma ? (character == ',') : StringUtilities::IsWhitespace(character))
			{
				if (split_values)
					SubmitValue();
				else
					value += character;
			}
			else if (character == '"')
			{
				state = VALUE_QUOTE;
				if (split_by_whitespace)
					SubmitValue();
				else
					value += (split_by_comma ? '"' : ' ');
			}
			else if (character == '(')
			{
				open_parentheses = 1;
				value += character;
				state = VALUE_PARENTHESIS;
			}
			else
			{
				value += character;
			}
		}
		break;
		case VALUE_PARENTHESIS:
		{
			if (character == '(')
			{
				open_parentheses++;
			}
			else if (character == ')')
			{
				open_parentheses--;
				if (open_parentheses == 0)
					state = VALUE;
			}
			else if (character == '"')
			{
				state = VALUE_QUOTE;
			}

			value += character;
		}
		break;
		case VALUE_QUOTE:
		{
			if (character == '"')
			{
				if (open_parentheses == 0)
				{
					state = VALUE;
					if (split_by_whitespace)
						SubmitValue();
					else
						value += (split_by_comma ? '"' : ' ');
				}
				else
				{
					state = VALUE_PARENTHESIS;
					value += character;
				}
			}
			else if (character == '\\')
			{
				state = VALUE_QUOTE_ESCAPE_NEXT;
			}
			else
			{
				value += character;
			}
		}
		break;
		case VALUE_QUOTE_ESCAPE_NEXT:
		{
			if (character == '"' || character == '\\')
			{
				value += character;
			}
			else
			{
				value += '\\';
				value += character;
			}
			state = VALUE_QUOTE;
		}
		break;
		}
	}

	if (state == VALUE)
		SubmitValue();
}